

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lodepng.cpp
# Opt level: O0

size_t lodepng_get_raw_size(uint w,uint h,LodePNGColorMode *color)

{
  uint uVar1;
  int in_ESI;
  int in_EDI;
  size_t n;
  size_t bpp;
  
  uVar1 = lodepng_get_bpp((LodePNGColorMode *)0x1197fb);
  return (ulong)((uint)(in_EDI * in_ESI) >> 3) * (ulong)uVar1 +
         (((ulong)(uint)(in_EDI * in_ESI) & 7) * (ulong)uVar1 + 7 >> 3);
}

Assistant:

size_t lodepng_get_raw_size(unsigned w, unsigned h, const LodePNGColorMode* color)
{
	/*will not overflow for any color type if roughly w * h < 268435455*/
	size_t bpp = lodepng_get_bpp(color);
	size_t n = w * h;
	return ((n / 8) * bpp) + ((n & 7) * bpp + 7) / 8;
}